

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValueShrinkableStorage.hpp
# Opt level: O2

void __thiscall
supermap::
KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
::KeyValueShrinkableStorage
          (KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
           *this,string *notSortedStorageFilename,string *sortedStorageFilename,
          shared_ptr<supermap::io::FileManager> *fileManager,
          InnerRegisterSupplier *innerRegisterSupplier)

{
  path local_e0;
  __shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2> local_b8;
  __shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2> local_a8;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/KeyValueShrinkableStorage.hpp:59:60)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/KeyValueShrinkableStorage.hpp:59:60)>
             ::_M_manager;
  IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  ::OrderedStorage(&this->
                    super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
                   ,(InnerRegisterSupplier *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  (this->
  super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  ).
  super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  ._vptr_OrderedStorage = (_func_int **)&PTR_append_001f59b8;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_e0,sortedStorageFilename,auto_format);
  std::__shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_a8,
             &fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>
            );
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/KeyValueShrinkableStorage.hpp:62:24)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/KeyValueShrinkableStorage.hpp:62:24)>
             ::_M_manager;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void,_supermap::Key<2UL>_>
  ::SingleFileIndexedStorage
            (&this->sortedStorage_,&local_e0,(shared_ptr<supermap::io::FileManager> *)&local_a8,
             (InnerRegisterSupplier *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
  std::filesystem::__cxx11::path::~path(&local_e0);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_e0,notSortedStorageFilename,auto_format);
  std::__shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_b8,
             &fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>
            );
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_80 = std::
             _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/KeyValueShrinkableStorage.hpp:65:27)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/KeyValueShrinkableStorage.hpp:65:27)>
             ::_M_manager;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  ::SingleFileIndexedStorage
            (&this->notSortedStorage_,&local_e0,(shared_ptr<supermap::io::FileManager> *)&local_b8,
             (InnerRegisterSupplier *)&local_98);
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
  std::filesystem::__cxx11::path::~path(&local_e0);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>_()>
  ::function(&this->innerRegisterSupplier_,innerRegisterSupplier);
  return;
}

Assistant:

explicit KeyValueShrinkableStorage(
        const std::string &notSortedStorageFilename,
        const std::string &sortedStorageFilename,
        std::shared_ptr<io::FileManager> fileManager,
        InnerRegisterSupplier innerRegisterSupplier
    ) : IndexedStorage<KeyValue<Key, Value>, IndexT, void>([]() { return std::make_unique<VoidRegister<KV>>(); }),
        sortedStorage_(sortedStorageFilename,
                       fileManager,
                       []() { return std::make_unique<VoidRegister<KV>>(); }),
        notSortedStorage_(notSortedStorageFilename,
                          fileManager,
                          []() { return std::make_unique<VoidRegister<KV>>(); }),
        innerRegisterSupplier_(std::move(innerRegisterSupplier)) {
    }